

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>
cmcmd_cmake_ninja_depends_fortran(string *arg_tdi,string *arg_pp)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  Value *pVVar5;
  undefined8 *puVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  __uniq_ptr_data<cmSourceInfo,_std::default_delete<cmSourceInfo>,_true,_true> extraout_RAX;
  __uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_> _Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  pointer *__ptr;
  undefined8 uVar8;
  const_iterator cVar9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  cmFortranCompiler fc;
  cmFortranSourceInfo finfo;
  cmFortranParser parser;
  undefined1 local_4f8 [8];
  size_type local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  string local_4d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  _Head_base<0UL,_cmSourceInfo_*,_false> local_450;
  long local_448;
  undefined1 local_440 [16];
  _Base_ptr local_430;
  _Base_ptr local_428;
  undefined1 local_420 [16];
  _Base_ptr local_410;
  _Base_ptr local_408;
  undefined1 local_400 [16];
  undefined1 local_3f0 [32];
  _Alloc_hider local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  _Alloc_hider local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_390;
  undefined1 local_378 [8];
  size_t local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  undefined1 local_328 [16];
  _Elt_pointer local_318;
  _Elt_pointer local_310;
  _Elt_pointer local_308;
  _Map_pointer local_300;
  undefined1 local_2f8 [16];
  _Elt_pointer local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  _Alloc_hider local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8 [3];
  _Alloc_hider local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  cmFortranParser_s local_238;
  
  local_450._M_head_impl = (cmSourceInfo *)local_440;
  local_448 = 0;
  local_440[0] = 0;
  local_430 = (_Base_ptr)local_420;
  local_428 = (_Base_ptr)0x0;
  local_420[0] = _S_red;
  local_410 = (_Base_ptr)local_400;
  local_408 = (_Base_ptr)0x0;
  local_400[0] = _S_red;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Json::Value::Value((Value *)&local_4b8,nullValue);
  std::ifstream::ifstream(&local_238,(arg_pp->_M_dataplus)._M_p,_S_in|_S_bin);
  Json::Reader::Reader((Reader *)local_378);
  bVar3 = Json::Reader::parse((Reader *)local_378,(istream *)&local_238,(Value *)&local_4b8,false);
  if (!bVar3) {
    std::operator+(&local_470,"-E cmake_ninja_depends failed to parse ",arg_pp);
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_4d8,(Reader *)local_378);
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      uVar8 = local_470.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_4d8._M_string_length + local_470._M_string_length) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        uVar8 = local_4d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_4d8._M_string_length + local_470._M_string_length) goto LAB_002691ff;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_4d8,0,(char *)0x0,(ulong)local_470._M_dataplus._M_p);
    }
    else {
LAB_002691ff:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_470,(ulong)local_4d8._M_dataplus._M_p)
      ;
    }
    local_4f8 = (undefined1  [8])&local_4e8;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar2) {
      local_4e8._M_allocated_capacity = paVar2->_M_allocated_capacity;
      local_4e8._8_8_ = puVar6[3];
    }
    else {
      local_4e8._M_allocated_capacity = paVar2->_M_allocated_capacity;
      local_4f8 = (undefined1  [8])*puVar6;
    }
    local_4f0 = puVar6[1];
    *puVar6 = paVar2;
    puVar6[1] = 0;
    paVar2->_M_local_buf[0] = '\0';
    cmSystemTools::Error((string *)local_4f8);
    if (local_4f8 != (undefined1  [8])&local_4e8) {
      operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
      operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
    (arg_tdi->_M_dataplus)._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_p != &local_280) {
      operator_delete(local_290._M_p,local_280._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_p != local_2c8) {
      operator_delete(local_2d8._M_p,local_2c8[0]._M_allocated_capacity + 1);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)local_328
              );
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_378);
    std::ifstream::~ifstream(&local_238);
    Json::Value::~Value((Value *)&local_4b8);
    goto LAB_00269788;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_p != &local_280) {
    operator_delete(local_290._M_p,local_280._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_p != local_2c8) {
    operator_delete(local_2d8._M_p,local_2c8[0]._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)local_328);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_378);
  std::ifstream::~ifstream(&local_238);
  pVVar5 = Json::Value::operator[]((Value *)&local_4b8,"include-dirs");
  bVar3 = Json::Value::isArray(pVVar5);
  if (bVar3) {
    cVar9 = Json::Value::begin(pVVar5);
    local_378 = (undefined1  [8])cVar9.super_ValueIteratorBase.current_._M_node;
    local_370 = CONCAT71(local_370._1_7_,cVar9.super_ValueIteratorBase.isNull_);
    cVar9 = Json::Value::end(pVVar5);
    local_4f8 = (undefined1  [8])cVar9.super_ValueIteratorBase.current_._M_node;
    local_4f0 = CONCAT71(local_4f0._1_7_,cVar9.super_ValueIteratorBase.isNull_);
    while( true ) {
      bVar3 = Json::ValueIteratorBase::isEqual((ValueIteratorBase *)local_378,(SelfType *)local_4f8)
      ;
      if (bVar3) break;
      pVVar5 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_378);
      Json::Value::asString_abi_cxx11_((string *)&local_238,pVVar5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_488,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.Compiler.Id._M_dataplus._M_p != &local_238.Compiler.Id.field_2) {
        operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                        local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
      }
      Json::ValueIteratorBase::increment((ValueIteratorBase *)local_378);
    }
  }
  pVVar5 = Json::Value::operator[]((Value *)&local_4b8,"compiler-id");
  Json::Value::asString_abi_cxx11_((string *)&local_238,pVVar5);
  std::__cxx11::string::operator=((string *)&local_450,(string *)&local_238);
  paVar2 = &local_238.Compiler.Id.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.Compiler.Id._M_dataplus._M_p != paVar2) {
    operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                    local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
  }
  pVVar5 = Json::Value::operator[]((Value *)&local_4b8,"submodule-sep");
  Json::Value::asString_abi_cxx11_((string *)&local_238,pVVar5);
  std::__cxx11::string::operator=((string *)&local_430,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.Compiler.Id._M_dataplus._M_p != paVar2) {
    operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                    local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
  }
  pVVar5 = Json::Value::operator[]((Value *)&local_4b8,"submodule-ext");
  Json::Value::asString_abi_cxx11_((string *)&local_238,pVVar5);
  std::__cxx11::string::operator=((string *)&local_410,(string *)&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.Compiler.Id._M_dataplus._M_p != paVar2) {
    operator_delete(local_238.Compiler.Id._M_dataplus._M_p,
                    local_238.Compiler.Id.field_2._M_allocated_capacity + 1);
  }
  Json::Value::~Value((Value *)&local_4b8);
  local_370 = 0;
  local_368._M_local_buf[0] = '\0';
  local_358._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_358._M_impl.super__Rb_tree_header._M_header;
  local_358._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_358._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_358._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_310 = (_Elt_pointer)(local_328 + 8);
  local_328._8_4_ = _S_red;
  local_318 = (_Elt_pointer)0x0;
  local_300 = (_Map_pointer)0x0;
  local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_2f8 + 8);
  local_2f8._8_4_ = _S_red;
  local_2e8 = (_Elt_pointer)0x0;
  local_2d0 = 0;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4b8._M_impl.super__Rb_tree_header._M_header;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4b8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3f0._0_8_ = (_Base_ptr)(local_3f0 + 0x10);
  local_378 = (undefined1  [8])&local_368;
  local_358._M_impl.super__Rb_tree_header._M_header._M_right =
       local_358._M_impl.super__Rb_tree_header._M_header._M_left;
  local_308 = local_310;
  local_2d8._M_p = (pointer)local_2e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3f0,local_450._M_head_impl,
             &((local_450._M_head_impl)->Provides)._M_t._M_impl.field_0x0 + local_448);
  local_3d0._M_p = (pointer)&local_3c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d0,local_430,
             (undefined1 *)((long)&local_430->_M_color + (long)&local_428->_M_color));
  local_3b0._M_p = (pointer)&local_3a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b0,local_410,
             (undefined1 *)((long)&local_410->_M_color + (long)&local_408->_M_color));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_390,&local_488);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&local_268,&local_4b8);
  cmFortranParser_s::cmFortranParser_s
            (&local_238,(cmFortranCompiler *)local_3f0,&local_390,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_268,(cmFortranSourceInfo *)local_378);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_p != &local_3a0) {
    operator_delete(local_3b0._M_p,local_3a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_p != &local_3c0) {
    operator_delete(local_3d0._M_p,(ulong)(local_3c0._M_allocated_capacity + 1));
  }
  if ((_Base_ptr)local_3f0._0_8_ != (_Base_ptr)(local_3f0 + 0x10)) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  bVar3 = cmFortranParser_FilePush(&local_238,(in_RDX->_M_dataplus)._M_p);
  if (bVar3) {
    iVar4 = cmFortran_yyparse(local_238.Scanner);
    if (iVar4 != 0) goto LAB_002695e8;
    this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(0x90);
    p_Var1 = &(this->_M_impl).super__Rb_tree_header;
    (this->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this->_M_impl).super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (this->_M_impl).super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (this->_M_impl).super__Rb_tree_header._M_node_count = 0;
    this[1]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    this[1]._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    this[1]._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    this[1]._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&this[2]._M_impl = 0;
    *(undefined8 *)&this[2]._M_impl.super__Rb_tree_header._M_header = 0;
    *(undefined8 *)&this[1]._M_impl = 0;
    *(undefined8 *)&this[1]._M_impl.super__Rb_tree_header._M_header = 0;
    *(undefined8 *)&this->_M_impl = 0;
    *(undefined8 *)&(this->_M_impl).super__Rb_tree_header._M_header = 0;
    (this->_M_impl).super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (this->_M_impl).super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    p_Var1 = &this[1]._M_impl.super__Rb_tree_header;
    this[1]._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    this[1]._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    p_Var1 = &this[2]._M_impl.super__Rb_tree_header;
    this[2]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    this[2]._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    this[2]._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    this[2]._M_impl.super__Rb_tree_header._M_node_count = 0;
    (arg_tdi->_M_dataplus)._M_p = (pointer)this;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this,&local_358);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this + 1,(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_328);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this + 2,(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f8);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8,
                   "-E cmake_ninja_depends failed to open ",in_RDX);
    cmSystemTools::Error((string *)local_4f8);
    if (local_4f8 != (undefined1  [8])&local_4e8) {
      operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
    }
LAB_002695e8:
    (arg_tdi->_M_dataplus)._M_p = (pointer)0x0;
  }
  cmFortranParser_s::~cmFortranParser_s(&local_238);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_4b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_328);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_358);
  if (local_378 != (undefined1  [8])&local_368) {
    operator_delete((void *)local_378,
                    CONCAT71(local_368._M_allocated_capacity._1_7_,local_368._M_local_buf[0]) + 1);
  }
LAB_00269788:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_488);
  if (local_410 != (_Base_ptr)local_400) {
    operator_delete(local_410,CONCAT71(local_400._1_7_,local_400[0]) + 1);
  }
  if (local_430 != (_Base_ptr)local_420) {
    operator_delete(local_430,CONCAT71(local_420._1_7_,local_420[0]) + 1);
  }
  _Var7._M_t.super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
  super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl =
       (tuple<cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>)local_440;
  if ((tuple<cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>)local_450._M_head_impl !=
      (_Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>)
      _Var7._M_t.super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
      super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl) {
    operator_delete(local_450._M_head_impl,CONCAT71(local_440._1_7_,local_440[0]) + 1);
    _Var7._M_t.super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
    super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl =
         (tuple<cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>)
         (tuple<cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>)
         extraout_RAX.super___uniq_ptr_impl<cmSourceInfo,_std::default_delete<cmSourceInfo>_>._M_t.
         super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
         super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl;
  }
  return (unique_ptr<cmSourceInfo,_std::default_delete<cmSourceInfo>_>)
         _Var7._M_t.super__Tuple_impl<0UL,_cmSourceInfo_*,_std::default_delete<cmSourceInfo>_>.
         super__Head_base<0UL,_cmSourceInfo_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<cmSourceInfo> cmcmd_cmake_ninja_depends_fortran(
  std::string const& arg_tdi, std::string const& arg_pp)
{
  cmFortranCompiler fc;
  std::vector<std::string> includes;
  {
    Json::Value tdio;
    Json::Value const& tdi = tdio;
    {
      cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
      Json::Reader reader;
      if (!reader.parse(tdif, tdio, false)) {
        cmSystemTools::Error("-E cmake_ninja_depends failed to parse " +
                             arg_tdi + reader.getFormattedErrorMessages());
        return nullptr;
      }
    }

    Json::Value const& tdi_include_dirs = tdi["include-dirs"];
    if (tdi_include_dirs.isArray()) {
      for (auto const& tdi_include_dir : tdi_include_dirs) {
        includes.push_back(tdi_include_dir.asString());
      }
    }

    Json::Value const& tdi_compiler_id = tdi["compiler-id"];
    fc.Id = tdi_compiler_id.asString();

    Json::Value const& tdi_submodule_sep = tdi["submodule-sep"];
    fc.SModSep = tdi_submodule_sep.asString();

    Json::Value const& tdi_submodule_ext = tdi["submodule-ext"];
    fc.SModExt = tdi_submodule_ext.asString();
  }

  cmFortranSourceInfo finfo;
  std::set<std::string> defines;
  cmFortranParser parser(fc, includes, defines, finfo);
  if (!cmFortranParser_FilePush(&parser, arg_pp.c_str())) {
    cmSystemTools::Error("-E cmake_ninja_depends failed to open " + arg_pp);
    return nullptr;
  }
  if (cmFortran_yyparse(parser.Scanner) != 0) {
    // Failed to parse the file.
    return nullptr;
  }

  auto info = cm::make_unique<cmSourceInfo>();
  info->Provides = finfo.Provides;
  info->Requires = finfo.Requires;
  info->Includes = finfo.Includes;
  return info;
}